

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteReg3U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,uint index)

{
  bool bVar1;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) && (local_c = (undefined1)R0, R0 < 0x100))
     && (((local_b = (undefined1)R1, R1 < 0x100 && (local_a = (undefined1)R2, R2 < 0x100)) &&
         (local_9 = (undefined1)index, index < 0x100)))) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_c,4,this);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteReg3U(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, uint index)
    {
        OpLayoutT_Reg3U<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.SlotIndex, index))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }